

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O1

ValueArray<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>,_std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>,_std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>,_std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>,_std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>,_std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
* __thiscall
testing::
Values<std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>>
          (ValueArray<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>,_std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>,_std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>,_std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>,_std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>,_std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
           *__return_storage_ptr__,testing *this,
          tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)> *v,
          tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)> *v_1,
          tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)> *v_2,
          tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)> *v_3,
          tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)> *v_4,
          tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)> *v_5)

{
  internal::
  FlatTupleBase<testing::internal::FlatTuple<std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>>,testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul,5ul>>
  ::
  FlatTupleBase<std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>>
            ((FlatTupleBase<testing::internal::FlatTuple<std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>>,testing::internal::IndexSequence<0ul,1ul,2ul,3ul,4ul,5ul>>
              *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

internal::ValueArray<T...> Values(T... v) {
  return internal::ValueArray<T...>(std::move(v)...);
}